

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlrole.c
# Opt level: O2

int element7(PROLOG_STATE *state,int tok,char *UNUSED_ptr,char *UNUSED_end,ENCODING *UNUSED_enc)

{
  uint *puVar1;
  int iVar2;
  bool bVar3;
  
  switch(tok) {
  case 0x23:
    puVar1 = &state->level;
    *puVar1 = *puVar1 - 1;
    bVar3 = *puVar1 == 0;
    iVar2 = 0x2f;
    break;
  case 0x24:
    puVar1 = &state->level;
    *puVar1 = *puVar1 - 1;
    bVar3 = *puVar1 == 0;
    iVar2 = 0x2e;
    break;
  case 0x25:
    puVar1 = &state->level;
    *puVar1 = *puVar1 - 1;
    bVar3 = *puVar1 == 0;
    iVar2 = 0x30;
    break;
  case 0x26:
    state->handler = element6;
    return 0x32;
  default:
    if (tok == 0xf) {
      iVar2 = 0x27;
    }
    else if (tok == 0x15) {
      state->handler = element6;
      iVar2 = 0x31;
    }
    else {
      if (tok == 0x18) {
        puVar1 = &state->level;
        *puVar1 = *puVar1 - 1;
        bVar3 = *puVar1 == 0;
        iVar2 = 0x2d;
        break;
      }
      state->handler = error;
      iVar2 = -1;
    }
    return iVar2;
  }
  if (!bVar3) {
    return iVar2;
  }
  state->handler = declClose;
  state->role_none = 0x27;
  return iVar2;
}

Assistant:

static int PTRCALL
element7(PROLOG_STATE *state,
         int tok,
         const char *UNUSED_P(ptr),
         const char *UNUSED_P(end),
         const ENCODING *UNUSED_P(enc))
{
  switch (tok) {
  case XML_TOK_PROLOG_S:
    return XML_ROLE_ELEMENT_NONE;
  case XML_TOK_CLOSE_PAREN:
    state->level -= 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = XML_ROLE_ELEMENT_NONE;
    }
    return XML_ROLE_GROUP_CLOSE;
  case XML_TOK_CLOSE_PAREN_ASTERISK:
    state->level -= 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = XML_ROLE_ELEMENT_NONE;
    }
    return XML_ROLE_GROUP_CLOSE_REP;
  case XML_TOK_CLOSE_PAREN_QUESTION:
    state->level -= 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = XML_ROLE_ELEMENT_NONE;
    }
    return XML_ROLE_GROUP_CLOSE_OPT;
  case XML_TOK_CLOSE_PAREN_PLUS:
    state->level -= 1;
    if (state->level == 0) {
      state->handler = declClose;
      state->role_none = XML_ROLE_ELEMENT_NONE;
    }
    return XML_ROLE_GROUP_CLOSE_PLUS;
  case XML_TOK_COMMA:
    state->handler = element6;
    return XML_ROLE_GROUP_SEQUENCE;
  case XML_TOK_OR:
    state->handler = element6;
    return XML_ROLE_GROUP_CHOICE;
  }
  return common(state, tok);
}